

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.cc
# Opt level: O0

void __thiscall trng::mrg2::seed(mrg2 *this,result_type s1,result_type s2)

{
  result_type s2_local;
  result_type s1_local;
  mrg2 *this_local;
  
  (this->S).r[0] = s1 % 0x7fffffff;
  if ((this->S).r[0] < 0) {
    (this->S).r[0] = (this->S).r[0] + 0x7fffffff;
  }
  (this->S).r[1] = s2 % 0x7fffffff;
  if ((this->S).r[1] < 0) {
    (this->S).r[1] = (this->S).r[1] + 0x7fffffff;
  }
  return;
}

Assistant:

void mrg2::seed(mrg2::result_type s1, mrg2::result_type s2) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
  }